

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_color _Var1;
  int final;
  _Base_ptr p_Var2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  pointer p_Var9;
  _Result<void> *p_Var10;
  iterator iVar11;
  undefined8 uVar12;
  ostream *poVar13;
  int j;
  _Rb_tree_node_base *p_Var14;
  int i;
  int iVar15;
  ulong uVar16;
  long lVar17;
  _Base_ptr p_Var18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *by;
  _Base_ptr p_Var19;
  pair<int,_int> pVar20;
  pair<int,_int> pVar21;
  ulong uVar22;
  bool bVar23;
  __allocator_type __a2;
  int startGrm;
  char **matrix;
  __allocator_type __a2_1;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futArr;
  adjacencyType DFA;
  type parallelClosure;
  indexArrayType indexArray;
  vector<edge,_std::allocator<edge>_> newEdges;
  adjacencyType RFA;
  startStatesType startStatesRFA;
  finalStatesType finalStatesRFA;
  __m256i ik;
  undefined1 local_251;
  undefined1 local_250 [8];
  _Alloc_hider a_Stack_248 [5];
  __state_type local_220;
  char **local_210;
  _Rb_tree_node_base *local_208;
  uint local_1fc;
  ulong local_1f8;
  _Base_ptr local_1f0;
  long *local_1e8;
  int local_1dc;
  thread local_1d8;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_1d0;
  adjacencyType local_1b0;
  char ***local_198;
  undefined8 *puStack_190;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined8 local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_178;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_170;
  vector<edge,_std::allocator<edge>_> local_158;
  adjacencyType local_140;
  time_point local_120;
  ulong local_118;
  long local_110;
  char *local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  __basic_future<void> local_f0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_b0;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_140.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)local_250,argv[1],(allocator *)&local_80);
  readRFA((string *)local_250,&local_140,(startStatesType *)&local_e0,(finalStatesType *)&local_b0,
          &numOfStatesRFA);
  std::__cxx11::string::~string((string *)local_250);
  local_1b0.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<edge,_std::allocator<edge>_>::vector(&local_158,0,(allocator_type *)local_250);
  std::__cxx11::string::string((string *)local_250,argv[2],(allocator *)&local_80);
  readDFA((string *)local_250,&local_1b0,&numOfStatesDFA,&local_158);
  std::__cxx11::string::~string((string *)local_250);
  uVar22 = (long)numOfStatesRFA * (long)numOfStatesDFA;
  matrixSize = (int)uVar22;
  iVar15 = (int)((long)((ulong)(uint)(matrixSize >> 0x1f) << 0x20 | uVar22 & 0xffffffff) % 0x20);
  uVar4 = (matrixSize - iVar15) + 0x20;
  if (iVar15 == 0) {
    uVar4 = matrixSize;
  }
  uVar16 = 0xffffffffffffffff;
  if (-1 < matrixSize) {
    uVar16 = uVar22 * 8;
  }
  local_210 = (char **)operator_new__(uVar16);
  local_1f8 = CONCAT44(local_1f8._4_4_,uVar4);
  for (lVar17 = 0; lVar17 < (int)uVar22; lVar17 = lVar17 + 1) {
    pcVar6 = (char *)operator_new__((long)(int)uVar4);
    local_210[lVar17] = pcVar6;
    pcVar6 = local_210[lVar17];
    for (uVar22 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar22; uVar22 = uVar22 + 1) {
      pcVar6[uVar22] = '\0';
    }
    uVar22 = (ulong)(uint)matrixSize;
  }
  local_120.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  p_Var8 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var8 != &local_e0._M_impl.super__Rb_tree_header) {
    _Var1 = p_Var8[1]._M_color;
    local_1f0 = p_Var8[1]._M_left;
    local_208 = p_Var8;
    for (p_Var19 = p_Var8[1]._M_parent; p_Var19 != local_1f0; p_Var19 = p_Var19 + 1) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&local_b0,(key_type *)p_Var19);
      p_Var18 = iVar7._M_node[2]._M_parent;
      for (p_Var8 = *(_Base_ptr *)(iVar7._M_node + 2); p_Var8 != p_Var18;
          p_Var8 = (_Base_ptr)&p_Var8->field_0x4) {
        if (_Var1 == p_Var8->_M_color) {
          for (iVar15 = 0; iVar15 < numOfStatesDFA; iVar15 = iVar15 + 1) {
            insertToFiniteAutomation(&local_1b0,iVar15,iVar15,(string *)p_Var19);
          }
        }
      }
    }
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_208);
  }
  uVar4 = std::thread::hardware_concurrency();
  local_198 = &local_210;
  uVar5 = (uint)matrixSize / uVar4;
  local_170._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puStack_190 = &local_80;
  local_80 = 0x101010101010101;
  uStack_78 = 0x101010101010101;
  uStack_70 = 0x101010101010101;
  uStack_68 = 0x101010101010101;
  auVar3._12_4_ = 0;
  auVar3._0_12_ = ZEXT812(0);
  local_170._M_impl.super__Vector_impl_data._0_16_ = auVar3 << 0x20;
  local_188 = (undefined4)local_1f8;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_170,
             (ulong)(uint)(numOfStatesRFA * numOfStatesDFA));
  local_1fc = uVar4 - 1;
  local_118 = (ulong)local_1fc;
  pVar21.first = 0;
  pVar21.second = 0;
  for (; (long)pVar21 < (long)numOfStatesDFA; pVar21 = (pair<int,_int>)((long)pVar21 + 1)) {
    pVar20 = pVar21;
    for (lVar17 = 0; lVar17 < numOfStatesRFA; lVar17 = lVar17 + 1) {
      local_250 = (undefined1  [8])pVar20;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_170,
                 (pair<int,_int> *)local_250);
      local_118 = (ulong)local_1fc;
      pVar20 = (pair<int,_int>)((long)pVar20 + 0x100000000);
    }
  }
  local_110 = local_118 << 4;
  local_1dc = uVar5 * (int)local_118;
  do {
    updateMatrix(&local_158,&local_140,local_210);
    local_1d0.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1d0.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d0.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
              (&local_1d0,local_118);
    iVar15 = 0;
    uVar4 = local_1fc;
    while (bVar23 = uVar4 != 0, uVar4 = uVar4 - 1, bVar23) {
      local_220.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_220.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var9 = (pointer)operator_new(0x68);
      local_250 = (undefined1  [8])&local_251;
      (p_Var9->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var9->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var9->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00123b08;
      *(undefined8 *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var9->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var9->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00123b58;
      a_Stack_248[0]._M_p = (pointer)p_Var9;
      p_Var10 = (_Result<void> *)operator_new(0x10);
      *(undefined8 *)p_Var10 = 0;
      *(undefined8 *)&p_Var10->field_0x8 = 0;
      std::__future_base::_Result<void>::_Result(p_Var10);
      local_1d8._M_id._M_thread = (id)0;
      *(_Result<void> **)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x30) = p_Var10;
      *(uint *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x38) = uVar5;
      *(uint *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x3c) = iVar15 * uVar5;
      *(char ****)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x40) = local_198;
      *(undefined8 **)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x48) = puStack_190;
      *(ulong *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x50) =
           CONCAT44(uStack_184,local_188);
      local_1e8 = (long *)operator_new(0x20);
      *local_1e8 = (long)&PTR___State_00123bb0;
      local_1e8[1] = (long)&p_Var9->_M_impl;
      local_1e8[2] = (long)std::__future_base::
                           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>,_void>
                           ::_M_run;
      local_1e8[3] = 0;
      std::thread::_M_start_thread(&local_1d8,&local_1e8,0);
      if (local_1e8 != (long *)0x0) {
        (**(code **)(*local_1e8 + 8))();
      }
      std::thread::operator=
                ((thread *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x20),&local_1d8);
      std::thread::~thread(&local_1d8);
      a_Stack_248[0]._M_p = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_IvanTyulyandin[P]challenge_main_cpp:142:28),_int,_int>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_IvanTyulyandin[P]challenge_main_cpp:142:28),_int,_int>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)local_250);
      local_180 = 0;
      _Stack_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_250 = (undefined1  [8])
                  local_220.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      a_Stack_248[0]._M_p =
           (pointer)local_220.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_220.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var9->_M_impl;
      local_220.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_248);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_178);
      if ((pair<int,_int>)
          local_220.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (pair<int,_int>)0x0) {
        p_Var9 = (pointer)operator_new(0x58);
        local_250 = (undefined1  [8])&local_1e8;
        (p_Var9->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var9->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var9->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00123bf0;
        *(undefined8 *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var9->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var9->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00123c40;
        a_Stack_248[0]._M_p = (pointer)p_Var9;
        p_Var10 = (_Result<void> *)operator_new(0x10);
        *(undefined8 *)p_Var10 = 0;
        *(undefined8 *)&p_Var10->field_0x8 = 0;
        std::__future_base::_Result<void>::_Result(p_Var10);
        a_Stack_248[0]._M_p = (pointer)0x0;
        *(_Result<void> **)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x20) = p_Var10;
        *(uint *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x28) = uVar5;
        *(uint *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x2c) = iVar15 * uVar5;
        *(ulong *)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x40) =
             CONCAT44(uStack_184,local_188);
        *(char ****)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x30) = local_198;
        *(undefined8 **)((long)&(p_Var9->_M_impl)._M_storage._M_storage + 0x38) = puStack_190;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_IvanTyulyandin[P]challenge_main_cpp:142:28),_int,_int>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_IvanTyulyandin[P]challenge_main_cpp:142:28),_int,_int>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)local_250);
        local_180 = 0;
        _Stack_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_250 = (undefined1  [8])
                    local_220.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        a_Stack_248[0]._M_p =
             (pointer)local_220.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_220.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&p_Var9->_M_impl;
        local_220.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_248);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_178);
      }
      std::__basic_future<void>::__basic_future(&local_f0,&local_220);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_220.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_1d0,
                 (future<void> *)&local_f0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f0._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      iVar15 = iVar15 + 1;
    }
    std::
    tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>
    ::type::operator()(&local_198,local_1dc,matrixSize - local_1dc);
    for (lVar17 = 0; local_110 != lVar17; lVar17 = lVar17 + 0x10) {
      std::future<void>::get
                ((future<void> *)
                 ((long)&((local_1d0.
                           super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super___basic_future<void>).
                         _M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar17));
    }
    std::vector<edge,_std::allocator<edge>_>::vector
              ((vector<edge,_std::allocator<edge>_> *)local_250,0,(allocator_type *)&local_220);
    std::vector<edge,_std::allocator<edge>_>::_M_move_assign
              (&local_158,(vector<edge,_std::allocator<edge>_> *)local_250);
    std::vector<edge,_std::allocator<edge>_>::~vector
              ((vector<edge,_std::allocator<edge>_> *)local_250);
    local_1f8 = 0;
    p_Var14 = (_Rb_tree_node_base *)0x0;
    while ((long)p_Var14 < (long)matrixSize) {
      local_108 = local_210[(long)p_Var14];
      local_220.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               CONCAT44(local_220.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._4_4_,
                        local_170._M_impl.super__Vector_impl_data._M_start[(long)p_Var14].second);
      local_208 = p_Var14;
      iVar11 = std::
               _Rb_tree<int,_std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::find(&local_e0,(key_type *)&local_220);
      if ((_Rb_tree_header *)iVar11._M_node != &local_e0._M_impl.super__Rb_tree_header) {
        local_100 = iVar11._M_node;
        for (p_Var8 = (_Base_ptr)0x0; (long)p_Var8 < (long)matrixSize;
            p_Var8 = (_Base_ptr)((long)&((_Alloc_hider *)&p_Var8->_M_color)->_M_p + 1)) {
          if (local_108[(long)p_Var8] != '\0') {
            local_f8 = iVar11._M_node[1]._M_left;
            _Var1 = local_170._M_impl.super__Vector_impl_data._M_start[(long)p_Var8].second;
            local_1f0 = p_Var8;
            for (p_Var19 = iVar11._M_node[1]._M_parent; p_Var19 != local_f8; p_Var19 = p_Var19 + 1)
            {
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::find(&local_b0,(key_type *)p_Var19);
              if ((_Rb_tree_header *)iVar7._M_node != &local_b0._M_impl.super__Rb_tree_header) {
                p_Var2 = iVar7._M_node[2]._M_parent;
                for (p_Var18 = *(_Base_ptr *)(iVar7._M_node + 2); iVar11._M_node = local_100,
                    p_Var8 = local_1f0, p_Var18 != p_Var2; p_Var18 = (_Base_ptr)&p_Var18->field_0x4)
                {
                  if (p_Var18->_M_color == _Var1) {
                    iVar15 = local_170._M_impl.super__Vector_impl_data._M_start[(long)local_208].
                             first;
                    final = local_170._M_impl.super__Vector_impl_data._M_start[(long)local_1f0].
                            first;
                    bVar23 = insertToFiniteAutomation(&local_1b0,iVar15,final,(string *)p_Var19);
                    if (bVar23) {
                      local_250._4_4_ = final;
                      local_250._0_4_ = iVar15;
                      std::__cxx11::string::string((string *)a_Stack_248,(string *)p_Var19);
                      std::vector<edge,_std::allocator<edge>_>::emplace_back<edge>
                                (&local_158,(edge *)local_250);
                      uVar12 = std::__cxx11::string::~string((string *)a_Stack_248);
                      local_1f8 = CONCAT71((int7)((ulong)uVar12 >> 8),1);
                    }
                  }
                }
              }
            }
          }
        }
      }
      p_Var14 = (_Rb_tree_node_base *)((long)&local_208->_M_color + 1);
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_1d0);
  } while ((local_1f8 & 1) != 0);
  std::__cxx11::string::string((string *)local_250,"",(allocator *)&local_1d0);
  getCurTime(local_120,(string *)local_250);
  std::__cxx11::string::~string((string *)local_250);
  iVar15 = countResult(&local_1b0);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
  std::operator<<(poVar13,"\n");
  iVar15 = matrixSize;
  for (lVar17 = 0; lVar17 < iVar15; lVar17 = lVar17 + 1) {
    if (local_210[lVar17] != (char *)0x0) {
      operator_delete__(local_210[lVar17]);
      iVar15 = matrixSize;
    }
  }
  if (local_210 != (char **)0x0) {
    operator_delete__(local_210);
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_170);
  std::vector<edge,_std::allocator<edge>_>::~vector(&local_158);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::~vector(&local_1b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_e0);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::~vector(&local_140);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

    adjacencyType RFA;
    startStatesType startStatesRFA;
    finalStatesType finalStatesRFA;
    readRFA(argv[1], RFA, startStatesRFA, finalStatesRFA, numOfStatesRFA);

    adjacencyType DFA;
    vector<edge> newEdges = vector<edge>(0);
    readDFA(argv[2], DFA, numOfStatesDFA, newEdges);

	matrixSize = numOfStatesDFA * numOfStatesRFA;

	int matrixSizeTo32 = matrixSize % 32 == 0 ? matrixSize : matrixSize + (32 - matrixSize % 32); // for AVX2
	auto matrix = new char * [matrixSize];
    for (auto i = 0; i < matrixSize; ++ i) {
        matrix[i] = new char[matrixSizeTo32];
        char * matrixRow = matrix[i];
        for (auto j = 0; j < matrixSizeTo32; ++ j) {
            matrixRow[j] = 0;
        }
    }

	auto start_time = std::chrono::steady_clock::now();

    // add edges to automation, if nonterminal start == end
    for (auto & iter : startStatesRFA) {
        int startGrm = iter.first;
        for (auto & by : iter.second) {
            auto finalsIter = finalStatesRFA.find(by);
            // if it is equal to end iterator => incorrect input
            for (auto finalGrm : finalsIter->second) {
                if (startGrm == finalGrm) {
                    for (auto i = 0; i < numOfStatesDFA; ++ i) {
                        insertToFiniteAutomation(DFA, i, i, by);
                    }
                }
            }
        }
    }

    bool needOneMoreStep = false;


    auto THREADS = std::thread::hardware_concurrency() - 1;
    int step = matrixSize / (THREADS + 1);

    __m256i ik = _mm256_set1_epi8(1); // PogChamp

    auto parallelClosure = [&matrix, &ik, matrixSizeTo32](int startK, int howMuch) {
        int endK = startK + howMuch;
        for (auto k = startK; k < endK; ++ k) {
            for (auto i = 0; i < matrixSize; ++ i) {
                char * matrixRow = matrix[i];
                if (matrixRow[k]) {
					for (auto j = 0; j < matrixSizeTo32; j += 32) {
						__m256i ij = _mm256_loadu_si256((__m256i const *) &matrixRow[j]);
						__m256i kj = _mm256_loadu_si256((__m256i const *) &matrix[k][j]);

						_mm256_storeu_si256((__m256i *) &matrixRow[j], _mm256_or_si256(ij, _mm256_and_si256(ik, kj)));
					}
//					for (auto j = 0; j < matrixSize; ++ j) {
//						if (matrix[k][j]) {
//							matrixRow[j] = true;
//						}
//					}
                }
            }
        }
    };

	indexArrayType indexArray;
	indexArray.reserve(static_cast<unsigned int>(numOfStatesDFA * numOfStatesRFA));

	for (int i = 0; i < numOfStatesDFA; ++ i) {
		for (int j = 0; j < numOfStatesRFA; ++ j) {
			indexArray.emplace_back(make_pair(i, j));
		}
	}

    do {
        needOneMoreStep = false;

        // stage 1: add info about new edges to matrix
        updateMatrix(newEdges, RFA, matrix);

        //getCurTime(start_time, "1 stage done");


        vector<future<void>> futArr;
        futArr.reserve(THREADS);
        for (auto i = 0; i < THREADS; ++ i) {
            futArr.emplace_back(std::async(launch::async, parallelClosure, i * step, step));
        }

        parallelClosure(THREADS * step, matrixSize - THREADS * step);

        for (auto i = 0; i < THREADS; ++ i) {
            futArr[i].get();
        }

        // stage 2: closure
        //getCurTime(start_time, "2 stage done");

		//cout << countResult(DFA) << " before\n";
        newEdges = vector<edge>(0);
        for (auto i = 0; i < matrixSize; ++ i) {
            char * matrixRow = matrix[i];
            int startGrm = indexArray[i].second;
            auto nonTermStartIter = startStatesRFA.find(startGrm);
            if (nonTermStartIter != startStatesRFA.end()) {
                for (auto j = 0; j < matrixSize; ++ j) {
                    if (matrixRow[j]) {
                        int finalGrm = indexArray[j].second;
                        for (auto & nonTerm : nonTermStartIter->second) {
                            auto nonTermFinalIter = finalStatesRFA.find(nonTerm);
                            if (nonTermFinalIter != finalStatesRFA.end()) {
                                for (auto finalStateForNonTerm : nonTermFinalIter->second) {
                                    if (finalStateForNonTerm == finalGrm) {
                                        int startDFA = indexArray[i].first;
                                        int finalDFA = indexArray[j].first;
                                        if (insertToFiniteAutomation(DFA, startDFA, finalDFA, nonTerm)) {
											newEdges.emplace_back(move(edge(startDFA, finalDFA, nonTerm)));
											needOneMoreStep = true;
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }

        }
        //getCurTime(start_time, "3 stage done");
		//cout << countResult(DFA) << " after\n";
    } while (needOneMoreStep);

    getCurTime(start_time, "");
    cout << countResult(DFA) << "\n";

    for (auto i = 0; i < matrixSize; ++ i) {
    	delete[](matrix[i]);
    }
    delete[](matrix);

}